

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O1

void __thiscall Json::Value::swap(Value *this,Value *other)

{
  undefined1 uVar1;
  ushort uVar2;
  ValueHolder VVar3;
  size_t sVar4;
  
  uVar1 = this->field_0x8;
  this->field_0x8 = other->field_0x8;
  other->field_0x8 = uVar1;
  VVar3 = this->value_;
  this->value_ = other->value_;
  other->value_ = VVar3;
  uVar2 = *(ushort *)&this->field_0x8;
  *(ushort *)&this->field_0x8 = uVar2 & 0xfeff | *(ushort *)&other->field_0x8 & 0x100;
  *(ushort *)&other->field_0x8 = (ushort)*(undefined4 *)&other->field_0x8 & 0xfeff | uVar2 & 0x100;
  sVar4 = this->start_;
  this->start_ = other->start_;
  other->start_ = sVar4;
  sVar4 = this->limit_;
  this->limit_ = other->limit_;
  other->limit_ = sVar4;
  return;
}

Assistant:

void Value::swap(Value& other) {
  ValueType temp = type_;
  type_ = other.type_;
  other.type_ = temp;
  std::swap(value_, other.value_);
  int temp2 = allocated_;
  allocated_ = other.allocated_;
  other.allocated_ = temp2;
  std::swap(start_, other.start_);
  std::swap(limit_, other.limit_);
}